

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall M2TSStreamInfo::M2TSStreamInfo(M2TSStreamInfo *this,PMTStreamInfo *pmtStreamInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double fps;
  VideoAspectRatio ar;
  bool interlaced;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  uint8_t uVar7;
  AbstractStreamReader *pAVar8;
  
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_index).
  super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = pmtStreamInfo->m_streamType;
  uVar2 = pmtStreamInfo->m_pid;
  this->streamPID = uVar2;
  this->stream_coding_type = uVar1;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::operator=(&this->m_index,&pmtStreamInfo->m_index);
  this->isSecondary = pmtStreamInfo->isSecondary;
  this->language_code[0] = '\0';
  this->language_code[1] = '\0';
  this->language_code[2] = '\0';
  this->language_code[3] = '\0';
  *(undefined2 *)this->language_code = *(undefined2 *)pmtStreamInfo->m_lang;
  this->language_code[2] = pmtStreamInfo->m_lang[2];
  this->character_code = '\0';
  this->video_format = '\0';
  this->frame_rate_index = '\0';
  this->number_of_offset_sequences = 0;
  this->audio_presentation_type = '\0';
  this->sampling_frequency_index = '\0';
  this->aspect_ratio_index = '\x03';
  pAVar8 = pmtStreamInfo->m_codecReader;
  if (pAVar8 == (AbstractStreamReader *)0x0) {
    return;
  }
  plVar6 = (long *)__dynamic_cast(pAVar8,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo
                                  ,0);
  if (plVar6 == (long *)0x0) goto LAB_001e5ad9;
  uVar4 = (**(code **)(*plVar6 + 0xa0))(plVar6);
  this->width = uVar4;
  uVar4 = (**(code **)(*plVar6 + 0xa8))(plVar6);
  this->height = uVar4;
  iVar5 = (**(code **)(*plVar6 + 0x48))(plVar6);
  this->HDR = iVar5;
  ar = *(VideoAspectRatio *)((long)plVar6 + 0x5c);
  fps = (double)plVar6[0x11];
  interlaced = (bool)(**(code **)(*plVar6 + 0xb0))(plVar6);
  blurayStreamParams(fps,interlaced,this->width,this->height,ar,&this->video_format,
                     &this->frame_rate_index,&this->aspect_ratio_index);
  if (ar == AR_221_100) {
    uVar4 = (this->height * 0xdd) / 100;
LAB_001e5ac5:
    this->width = uVar4;
  }
  else {
    if (ar == AR_16_9) {
      uVar4 = (uint)((ulong)(this->height << 4) * 0x38e38e39 >> 0x20);
LAB_001e5aac:
      uVar4 = uVar4 >> 1;
      goto LAB_001e5ac5;
    }
    if (ar == AR_3_4) {
      uVar4 = (uint)((ulong)(this->height << 2) * 0xaaaaaaab >> 0x20);
      goto LAB_001e5aac;
    }
  }
  pAVar8 = pmtStreamInfo->m_codecReader;
  if (pAVar8 == (AbstractStreamReader *)0x0) {
    return;
  }
LAB_001e5ad9:
  if ((pAVar8->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
      (_func_int **)&PTR__H264StreamReader_0023d850) {
    this->number_of_offset_sequences = *(int *)((long)&pAVar8[3].m_curPos + 4);
  }
  plVar6 = (long *)__dynamic_cast(pAVar8,&AbstractStreamReader::typeinfo,
                                  &SimplePacketizerReader::typeinfo,0);
  if (plVar6 != (long *)0x0) {
    bVar3 = (**(code **)(*plVar6 + 0xb8))(plVar6);
    this->audio_presentation_type = bVar3;
    uVar7 = '\x03';
    if ((bVar3 == 2) || (uVar7 = '\x06', 3 < bVar3)) {
      this->audio_presentation_type = uVar7;
    }
    iVar5 = (**(code **)(*plVar6 + 0xa8))(plVar6);
    if (iVar5 == 48000) {
      iVar5 = (**(code **)(*plVar6 + 0xb0))(plVar6);
      bVar3 = 0xe;
      if (iVar5 != 96000) {
        iVar5 = (**(code **)(*plVar6 + 0xb0))(plVar6);
        bVar3 = 1;
        if (iVar5 == 0x2ee00) {
          bVar3 = 0xc;
        }
      }
    }
    else if (iVar5 == 96000) {
      iVar5 = (**(code **)(*plVar6 + 0xb0))(plVar6);
      bVar3 = (iVar5 == 0x2ee00) << 3 | 4;
    }
    else {
      bVar3 = 5;
      if (iVar5 != 0x2ee00) {
        return;
      }
    }
    this->sampling_frequency_index = bVar3;
  }
  return;
}

Assistant:

M2TSStreamInfo::M2TSStreamInfo(const PMTStreamInfo& pmtStreamInfo)
{
    streamPID = pmtStreamInfo.m_pid;
    stream_coding_type = pmtStreamInfo.m_streamType;
    m_index = pmtStreamInfo.m_index;
    isSecondary = pmtStreamInfo.isSecondary;
    memset(&language_code, 0, 4);
    memcpy(language_code, pmtStreamInfo.m_lang, 3);

    character_code = 0;
    video_format = 0;
    frame_rate_index = 0;
    number_of_offset_sequences = 0;
    audio_presentation_type = 0;
    sampling_frequency_index = 0;
    aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    if (pmtStreamInfo.m_codecReader != nullptr)
    {
        const auto vStream = dynamic_cast<MPEGStreamReader*>(pmtStreamInfo.m_codecReader);
        if (vStream)
        {
            width = vStream->getStreamWidth();
            height = vStream->getStreamHeight();
            HDR = vStream->getStreamHDR();
            const VideoAspectRatio ar = vStream->getStreamAR();
            blurayStreamParams(vStream->getFPS(), vStream->getInterlaced(), width, height, ar, &video_format,
                               &frame_rate_index, &aspect_ratio_index);
            if (ar == VideoAspectRatio::AR_3_4)
                width = height * 4 / 3;
            else if (ar == VideoAspectRatio::AR_16_9)
                width = height * 16 / 9;
            else if (ar == VideoAspectRatio::AR_221_100)
                width = height * 221 / 100;
        }
        const auto h264Stream = dynamic_cast<H264StreamReader*>(pmtStreamInfo.m_codecReader);
        if (h264Stream)
            number_of_offset_sequences = h264Stream->getOffsetSeqCnt();

        const auto aStream = dynamic_cast<SimplePacketizerReader*>(pmtStreamInfo.m_codecReader);
        if (aStream)
        {
            audio_presentation_type = aStream->getChannels();
            if (audio_presentation_type == 2)
                audio_presentation_type = 3;
            else if (audio_presentation_type > 3)
                audio_presentation_type = 6;
            const int freq = aStream->getFreq();
            switch (freq)
            {
            case 48000:
                if (aStream->getAltFreq() == 96000)
                    sampling_frequency_index = 14;
                else if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 1;
                break;
            case 96000:
                if (aStream->getAltFreq() == 192000)
                    sampling_frequency_index = 12;
                else
                    sampling_frequency_index = 4;
                break;
            case 192000:
                sampling_frequency_index = 5;
                break;
            default:;
            }
        }
    }
}